

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnSelectExpr
          (ExprVisitorDelegate *this,SelectExpr *expr)

{
  WatWriter *this_00;
  bool bVar1;
  char *s;
  SelectExpr *expr_local;
  ExprVisitorDelegate *this_local;
  
  this_00 = this->writer_;
  s = Opcode::GetName((Opcode *)&Opcode::Select_Opcode);
  WritePutsSpace(this_00,s);
  bVar1 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::empty(&expr->result_type);
  if (!bVar1) {
    WriteTypes(this->writer_,&expr->result_type,"result");
  }
  WriteNewline(this->writer_,false);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnSelectExpr(SelectExpr* expr) {
  writer_->WritePutsSpace(Opcode::Select_Opcode.GetName());
  if (!expr->result_type.empty()) {
    writer_->WriteTypes(expr->result_type, "result");
  }
  writer_->WriteNewline(NO_FORCE_NEWLINE);
  return Result::Ok;
}